

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O2

void __thiscall Scs::Client::Run(Client *this)

{
  SocketPtr *this_00;
  void *pvVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  size_t __new_size;
  BufferPtr receivedData;
  BufferPtr receiveBuffer;
  AddressPtr address;
  __shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d0 [16];
  ReceiveQueue receiveQueue;
  
  CreateAddress((Scs *)&address,&this->m_port,&this->m_address);
  CreateBuffer();
  std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::reserve
            (receiveBuffer.
             super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x20000);
  ReceiveQueue::ReceiveQueue(&receiveQueue);
  lVar3 = std::chrono::_V2::system_clock::now();
  this_00 = &this->m_socket;
LAB_0010c1d3:
  do {
    if ((this->m_status)._M_i == Shutdown) {
LAB_0010c503:
      if ((this->m_onDisconnect).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(Scs::IClient_&)>::operator()(&this->m_onDisconnect,&this->super_IClient)
        ;
      }
      receivedData.
      super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      receivedData.
      super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2> *)&receivedData);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&receivedData.
                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ReceiveQueue::~ReceiveQueue(&receiveQueue);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&receiveBuffer.
                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&address.super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    receivedData.
    super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&receivedData);
    if ((this->m_status)._M_i != Initial) {
      if ((this->m_status)._M_i == Connecting) {
        lVar4 = std::chrono::_V2::system_clock::now();
        if (this->m_timeoutMs * 1000000 + lVar3 < lVar4) {
          bVar2 = Address::Next(address.super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
          if (bVar2) {
            LOCK();
            (this->m_status)._M_i = Initial;
            UNLOCK();
            lVar3 = std::chrono::_V2::system_clock::now();
            LogWriteLine("Client failed to connect - trying next address.");
          }
          else {
            LOCK();
            (this->m_status)._M_i = ConnectionTimeout;
            UNLOCK();
            LogWriteLine("Client failed to connect.");
          }
        }
        else {
          bVar2 = Socket::IsWritable((this_00->
                                     super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr);
          if (bVar2) {
            LOCK();
            (this->m_status)._M_i = Ready;
            UNLOCK();
            LogWriteLine("Client established connection with server.");
            if ((this->m_onConnect).super__Function_base._M_manager != (_Manager_type)0x0) {
              std::function<void_(Scs::IClient_&)>::operator()
                        (&this->m_onConnect,&this->super_IClient);
            }
          }
        }
      }
      else if ((this->m_status)._M_i == ConnectionTimeout) {
        LogWriteLine("Client retry not yet implemented.  Shutting down client.");
        LOCK();
        (this->m_error)._M_base._M_i = true;
        UNLOCK();
        LOCK();
        (this->m_status)._M_i = Shutdown;
        UNLOCK();
      }
      else if ((this->m_status)._M_i == Ready) {
        if ((this->m_onUpdate).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::function<void_(Scs::IClient_&)>::operator()(&this->m_onUpdate,&this->super_IClient);
        }
        bVar2 = Socket::IsWritable((this_00->
                                   super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr);
        if (bVar2) {
          bVar2 = SendQueue::Empty(&this->m_sendQueue);
          if (!bVar2) {
            std::__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_f0,
                       &this_00->super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>);
            bVar2 = SendQueue::Send(&this->m_sendQueue,(SocketPtr *)&local_f0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
            if (!bVar2) {
              LogWriteLine("Error sending data to server.  Shutting down connection.");
              LOCK();
              (this->m_status)._M_i = Shutdown;
              UNLOCK();
              goto LAB_0010c503;
            }
            receivedData.
            super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)&DAT_0000000a;
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&receivedData);
          }
        }
        bVar2 = Socket::IsReadable((this_00->
                                   super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr);
        if (bVar2) {
          std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                    (receiveBuffer.
                     super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,*(long *)&((receiveBuffer.
                                         super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->
                                       super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                       )._M_impl.field_0x10 -
                             *(long *)&((receiveBuffer.
                                         super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->
                                       super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                       )._M_impl);
          pvVar1 = *(void **)&((receiveBuffer.
                                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->
                              super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                              _M_impl;
          __new_size = Socket::Receive((this_00->
                                       super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr,pvVar1,
                                       *(long *)&((receiveBuffer.
                                                                                                      
                                                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->
                                                 super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                                 )._M_impl.field_0x10 - (long)pvVar1,0);
          if (__new_size != 0) {
            std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                      (receiveBuffer.
                       super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,__new_size);
            pvVar1 = *(void **)&((receiveBuffer.
                                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->
                                super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                                _M_impl;
            ReceiveQueue::Push(&receiveQueue,pvVar1,
                               *(long *)&((receiveBuffer.
                                           super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->
                                         super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                         )._M_impl.field_0x8 - (long)pvVar1);
            lVar4 = *(long *)&((receiveBuffer.
                                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->
                              super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                              _M_impl;
            if (*(long *)&((receiveBuffer.
                            super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->
                          super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>)._M_impl
                          .field_0x8 != lVar4) {
              *(long *)&((receiveBuffer.
                          super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                        )._M_impl.field_0x8 = lVar4;
            }
            ReceiveQueue::Pop((ReceiveQueue *)&receivedData);
            while (receivedData.
                   super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr != (element_type *)0x0) {
              if ((this->m_onReceiveData).super__Function_base._M_manager != (_Manager_type)0x0) {
                pvVar1 = *(void **)&((receivedData.
                                      super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->
                                    super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                    )._M_impl;
                std::function<void_(Scs::IClient_&,_const_void_*,_unsigned_long)>::operator()
                          (&this->m_onReceiveData,&this->super_IClient,pvVar1,
                           *(long *)&((receivedData.
                                       super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                     )._M_impl.field_0x8 - (long)pvVar1);
              }
              ReceiveQueue::Pop((ReceiveQueue *)local_d0);
              std::
              __shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ::operator=((__shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           *)&receivedData,
                          (__shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           *)local_d0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&receivedData.
                        super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
      }
      goto LAB_0010c1d3;
    }
    std::__shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,&address.super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>);
    CreateSocket((Scs *)&receivedData,(AddressPtr *)&local_e0);
    std::__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2> *)&receivedData);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&receivedData.
                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    Socket::SetNonBlocking
              ((this_00->super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,true);
    bVar2 = Socket::Connect((this_00->super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
    if (!bVar2) {
      LogWriteLine("Error connecting client socket.");
      LOCK();
      (this->m_status)._M_i = Shutdown;
      UNLOCK();
      LOCK();
      (this->m_error)._M_base._M_i = true;
      UNLOCK();
      goto LAB_0010c503;
    }
    LOCK();
    (this->m_status)._M_i = Connecting;
    UNLOCK();
    lVar3 = std::chrono::_V2::system_clock::now();
    receivedData.
    super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x64;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&receivedData);
  } while( true );
}

Assistant:

void Client::Run()
{
	// Create address from port and address strings
	AddressPtr address = CreateAddress(m_port, m_address);

	// Create a receive buffer
	BufferPtr receiveBuffer = CreateBuffer();
	receiveBuffer->reserve(RECEIVE_BUFFER_SIZE);

	// Create a receive queue
	ReceiveQueue receiveQueue;

	// Mark initial time
	auto statusTime = std::chrono::system_clock::now();

	// Loop until we get a shutdown request
	while (m_status != Status::Shutdown)
	{
		// We don't want to burn too much CPU while idling.
		std::this_thread::sleep_for(std::chrono::milliseconds(1));

		if (m_status == Status::Initial)
		{
			m_socket = CreateSocket(address);
			m_socket->SetNonBlocking(true);
			if (!m_socket->Connect())
			{
				LogWriteLine("Error connecting client socket.");
				m_status = Status::Shutdown;
				m_error = true;
				break;
			}
			m_status = Status::Connecting;
			statusTime = std::chrono::system_clock::now();

            // On macOS, without this slight delay after a connect attempt, the socket returns immediate
            // success on IsWriteable(), even if no connection is present.
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
		}
		else if (m_status == Status::Connecting)
		{
			if (std::chrono::system_clock::now() > statusTime + std::chrono::milliseconds(m_timeoutMs))
			{
				if (address->Next())
				{
					m_status = Status::Initial;
					statusTime = std::chrono::system_clock::now();
					LogWriteLine("Client failed to connect - trying next address.");
				}
				else
				{
					m_status = Status::ConnectionTimeout;
					LogWriteLine("Client failed to connect.");
				}
			}
			else
			{
				if (m_socket->IsWritable())
				{
                    m_status = Status::Ready;
                    LogWriteLine("Client established connection with server.");
					if (m_onConnect)
						m_onConnect(*this);
				}
			}
		}
		else if (m_status == Status::ConnectionTimeout)
		{
			// TODO: Wait some period and try again for a limited number of tries.  For now, we just fail
			LogWriteLine("Client retry not yet implemented.  Shutting down client.");
			m_error = true;
			m_status = Status::Shutdown;
		}
		else if (m_status == Status::Ready)
		{
			if (m_onUpdate)
				m_onUpdate(*this);

			// Check first to see if we can write to the socket
			if (m_socket->IsWritable())
			{
				if (!m_sendQueue.Empty())
				{
					if (!m_sendQueue.Send(m_socket))
					{
						LogWriteLine("Error sending data to server.  Shutting down connection.");
						m_status = Status::Shutdown;
						break;
					}

					// We need to throttle our connection transmission rate
					std::this_thread::sleep_for(std::chrono::milliseconds(SEND_THROTTLE_MS));
				}
			}

			// Check for incoming data
			if (m_socket->IsReadable())
			{
				// Read data from socket
				receiveBuffer->resize(receiveBuffer->capacity());
				size_t bytesReceived = m_socket->Receive(receiveBuffer->data(), receiveBuffer->capacity(), 0);
				if (bytesReceived)
				{
					// Push data into the receive queue
					receiveBuffer->resize(bytesReceived);
					receiveQueue.Push(receiveBuffer->data(), receiveBuffer->size());
					receiveBuffer->clear();

					// Process data in receive queue
					BufferPtr receivedData = receiveQueue.Pop();
					while (receivedData)
					{
						if (m_onReceiveData)
							m_onReceiveData(*this, receivedData->data(), receivedData->size());
						receivedData = receiveQueue.Pop();
					}
				}
			}
		}
	}

	if (m_onDisconnect)
		m_onDisconnect(*this);
	m_socket = nullptr;
}